

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O1

REF_STATUS
ref_recon_gradient(REF_GRID ref_grid,REF_DBL *scalar,REF_DBL *grad,REF_RECON_RECONSTRUCTION recon)

{
  uint uVar1;
  uint uVar2;
  
  if (recon == REF_RECON_KEXACT) {
    uVar2 = ref_recon_kexact_gradient_hessian(ref_grid,scalar,grad,(REF_DBL *)0x0);
    uVar1 = 0;
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x544
             ,"ref_recon_gradient",(ulong)uVar2,"k-exact");
      uVar1 = uVar2;
    }
  }
  else if (recon == REF_RECON_L2PROJECTION) {
    uVar1 = ref_recon_l2_projection_grad(ref_grid,scalar,grad);
    if ((uVar1 & 0xfffffffb) == 0) {
      uVar1 = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x540
             ,"ref_recon_gradient",(ulong)uVar1,"l2");
    }
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x548,
           "ref_recon_gradient","reconstruction not available");
    uVar1 = 1;
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_recon_gradient(REF_GRID ref_grid, REF_DBL *scalar,
                                      REF_DBL *grad,
                                      REF_RECON_RECONSTRUCTION recon) {
  switch (recon) {
    case REF_RECON_L2PROJECTION:
      RXS(ref_recon_l2_projection_grad(ref_grid, scalar, grad), REF_DIV_ZERO,
          "l2");
      break;
    case REF_RECON_KEXACT:
      RSS(ref_recon_kexact_gradient_hessian(ref_grid, scalar, grad, NULL),
          "k-exact");
      break;
    case REF_RECON_LAST:
    default:
      THROW("reconstruction not available");
  }

  return REF_SUCCESS;
}